

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalSerialize
          (SourceCodeInfo_Location *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  size_t __n;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 aVar3;
  int iVar4;
  uint8_t *puVar5;
  const_pointer piVar6;
  byte *pbVar7;
  ulong uVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar9;
  uint uVar10;
  int index;
  char *in_R9;
  undefined8 *puVar11;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  LogMessageFatal local_40;
  
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  if (0 < (int)uVar10) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar5) goto LAB_0017f240;
    pRVar1 = &(this->field_0)._impl_.path_;
    *puVar5 = '\n';
    target = puVar5 + 2;
    for (; 0x7f < uVar10; uVar10 = uVar10 >> 7) {
      target[-1] = (byte)uVar10 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar10;
    piVar6 = RepeatedField<int>::data(pRVar1);
    iVar4 = RepeatedField<int>::size(pRVar1);
    piVar2 = piVar6 + iVar4;
    do {
      pbVar7 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar8 = (ulong)*piVar6; target = pbVar7 + 1, 0x7f < uVar8; uVar8 = uVar8 >> 7) {
        *pbVar7 = (byte)uVar8 | 0x80;
        pbVar7 = target;
      }
      piVar6 = piVar6 + 1;
      *pbVar7 = (byte)uVar8;
    } while (piVar6 < piVar2);
  }
  uVar10 = *(uint *)((long)&this->field_0 + 0x30);
  if (0 < (int)uVar10) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar5) {
LAB_0017f240:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pRVar1 = &(this->field_0)._impl_.span_;
    *puVar5 = '\x12';
    target = puVar5 + 2;
    for (; 0x7f < uVar10; uVar10 = uVar10 >> 7) {
      target[-1] = (byte)uVar10 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar10;
    piVar6 = RepeatedField<int>::data(pRVar1);
    iVar4 = RepeatedField<int>::size(pRVar1);
    piVar2 = piVar6 + iVar4;
    do {
      pbVar7 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar8 = (ulong)*piVar6; target = pbVar7 + 1, 0x7f < uVar8; uVar8 = uVar8 >> 7) {
        *pbVar7 = (byte)uVar8 | 0x80;
        pbVar7 = target;
      }
      piVar6 = piVar6 + 1;
      *pbVar7 = (byte)uVar8;
    } while (piVar6 < piVar2);
  }
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
    puVar11 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.leading_comments_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
              );
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.SourceCodeInfo.Location.leading_comments";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x38,field_name);
    s._M_str = (char *)*puVar11;
    s._M_len = puVar11[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,s,target);
  }
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
    puVar11 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.trailing_comments_.tagged_ptr_.ptr_ &
              0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.SourceCodeInfo.Location.trailing_comments";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x39,field_name_00
              );
    s_00._M_str = (char *)*puVar11;
    s_00._M_len = puVar11[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,4,s_00,target);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x40);
  index = 0;
  if (iVar4 < 1) {
    iVar4 = index;
  }
  for (; iVar4 != index; index = index + 1) {
    pVVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.leading_detached_comments_.
                         super_RepeatedPtrFieldBase,index);
    field_name_01._M_str = in_R9;
    field_name_01._M_len =
         (size_t)"google.protobuf.SourceCodeInfo.Location.leading_detached_comments";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar9->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar9->_M_string_length,1,0x41,field_name_01);
    __n = pVVar9->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 0x32;
      target[1] = (byte)__n;
      memcpy(target + 2,(pVVar9->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      s_01._M_str = (pVVar9->_M_dataplus)._M_p;
      s_01._M_len = __n;
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,6,s_01,target);
    }
  }
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) == 0) {
    return target;
  }
  puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar5;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL SourceCodeInfo_Location::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const SourceCodeInfo_Location& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  // repeated int32 span = 2 [packed = true];
  {
    int byte_size = this_._impl_._span_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_span(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string leading_comments = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_leading_comments();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional string trailing_comments = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_trailing_comments();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target = stream->WriteStringMaybeAliased(4, _s, target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this_._internal_leading_detached_comments_size(); i < n; ++i) {
    const auto& s = this_._internal_leading_detached_comments().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = stream->WriteString(6, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}